

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O2

void destroy_test_suite(TestSuite *suiteToDestroy)

{
  UnitTest *__ptr;
  TestSuite *suiteToDestroy_00;
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0x10;
  for (lVar2 = 0; __ptr = suiteToDestroy->tests, lVar2 < suiteToDestroy->size; lVar2 = lVar2 + 1) {
    suiteToDestroy_00 = *(TestSuite **)((long)&__ptr->type + lVar1);
    if (suiteToDestroy_00 != (TestSuite *)0x0 && *(int *)((long)__ptr + lVar1 + -0x10) == 1) {
      *(undefined8 *)((long)&__ptr->type + lVar1) = 0;
      destroy_test_suite(suiteToDestroy_00);
    }
    lVar1 = lVar1 + 0x18;
  }
  free(__ptr);
  free(suiteToDestroy);
  return;
}

Assistant:

void destroy_test_suite(TestSuite *suiteToDestroy) {
    int i;
    for (i = 0; i < suiteToDestroy->size; i++) {
        UnitTest test = suiteToDestroy->tests[i];
        TestSuite* suite = test.Runnable.suite;
        if (test_suite == test.type && suite != NULL) {
           suiteToDestroy->tests[i].Runnable.suite = NULL;
           destroy_test_suite(suite);
        }
    }

    if (suiteToDestroy->tests != NULL)
        free(suiteToDestroy->tests);

    free(suiteToDestroy);
}